

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

string * pybind11::type_id<std::__cxx11::string>(void)

{
  char *in_RDX;
  string *in_RDI;
  
  detail::clean_type_id_abi_cxx11_
            (in_RDI,(detail *)"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",in_RDX);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    return detail::clean_type_id(typeid(T).name());
}